

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polyline.cc
# Opt level: O2

S2Polyline * __thiscall S2Polyline::operator=(S2Polyline *this,S2Polyline *other)

{
  int iVar1;
  
  this->s2debug_override_ = other->s2debug_override_;
  iVar1 = other->num_vertices_;
  other->num_vertices_ = 0;
  this->num_vertices_ = iVar1;
  std::__uniq_ptr_impl<Vector3<double>,_std::default_delete<Vector3<double>[]>_>::operator=
            ((__uniq_ptr_impl<Vector3<double>,_std::default_delete<Vector3<double>[]>_> *)
             &this->vertices_,
             (__uniq_ptr_impl<Vector3<double>,_std::default_delete<Vector3<double>[]>_> *)
             &other->vertices_);
  return this;
}

Assistant:

S2Polyline& S2Polyline::operator=(S2Polyline&& other) {
  s2debug_override_ = other.s2debug_override_;
  num_vertices_ = absl::exchange(other.num_vertices_, 0);
  vertices_ = std::move(other.vertices_);
  return *this;
}